

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglcompositor.cpp
# Opt level: O3

void __thiscall
QOpenGLCompositor::renderAll(QOpenGLCompositor *this,QOpenGLFramebufferObject *fbo,Origin origin)

{
  QOpenGLTextureBlitter *this_00;
  ulong uVar1;
  bool bVar2;
  socklen_t in_ECX;
  socklen_t __len;
  undefined4 in_register_00000014;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *__addr;
  ulong uVar3;
  
  if (fbo != (QOpenGLFramebufferObject *)0x0) {
    QOpenGLFramebufferObject::bind
              (fbo,(int)fbo,(sockaddr *)CONCAT44(in_register_00000014,origin),in_ECX);
  }
  glClear(0x4500);
  __len = ((this->m_nativeTargetGeometry).y2.m_i - (this->m_nativeTargetGeometry).y1.m_i) + 1;
  glViewport(0,0,((this->m_nativeTargetGeometry).x2.m_i - (this->m_nativeTargetGeometry).x1.m_i) + 1
            );
  this_00 = &this->m_blitter;
  bVar2 = QOpenGLTextureBlitter::isCreated(this_00);
  __addr = extraout_RDX;
  if (!bVar2) {
    QOpenGLTextureBlitter::create(this_00);
    __addr = extraout_RDX_00;
  }
  QOpenGLTextureBlitter::bind(this_00,0xde1,__addr,__len);
  if ((this->m_windows).d.size != 0) {
    uVar3 = 0;
    do {
      (**(code **)(*(long *)(this->m_windows).d.ptr[uVar3] + 0x20))();
      uVar3 = uVar3 + 1;
      uVar1 = (this->m_windows).d.size;
    } while (uVar3 < uVar1);
    if (uVar1 != 0) {
      uVar3 = 0;
      do {
        render(this,(this->m_windows).d.ptr[uVar3],origin);
        uVar3 = uVar3 + 1;
      } while (uVar3 < (ulong)(this->m_windows).d.size);
    }
  }
  QOpenGLTextureBlitter::release(this_00);
  if (fbo == (QOpenGLFramebufferObject *)0x0) {
    QOpenGLContext::swapBuffers((QSurface *)this->m_context);
  }
  else {
    QOpenGLFramebufferObject::release(fbo);
  }
  if ((this->m_windows).d.size != 0) {
    uVar3 = 0;
    do {
      (**(code **)(*(long *)(this->m_windows).d.ptr[uVar3] + 0x28))();
      uVar3 = uVar3 + 1;
    } while (uVar3 < (ulong)(this->m_windows).d.size);
  }
  return;
}

Assistant:

void QOpenGLCompositor::renderAll(QOpenGLFramebufferObject *fbo, QOpenGLTextureBlitter::Origin origin)
{
    if (fbo)
        fbo->bind();

    glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);
    glViewport(0, 0, m_nativeTargetGeometry.width(), m_nativeTargetGeometry.height());

    if (!m_blitter.isCreated())
        m_blitter.create();

    m_blitter.bind();

    for (int i = 0; i < m_windows.size(); ++i)
        m_windows.at(i)->beginCompositing();

    for (int i = 0; i < m_windows.size(); ++i)
        render(m_windows.at(i), origin);

    m_blitter.release();
    if (!fbo)
        m_context->swapBuffers(m_targetWindow);
    else
        fbo->release();

    for (int i = 0; i < m_windows.size(); ++i)
        m_windows.at(i)->endCompositing();
}